

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackExternalGenerator.cxx
# Opt level: O3

bool __thiscall cmCPackExternalGenerator::StagingEnabled(cmCPackExternalGenerator *this)

{
  bool bVar1;
  cmValue cVar2;
  string_view value;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"CPACK_EXTERNAL_ENABLE_STAGING","");
  cVar2 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_38);
  if (cVar2.Value == (string *)0x0) {
    bVar1 = false;
  }
  else {
    value._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
    value._M_len = (cVar2.Value)->_M_string_length;
    bVar1 = cmValue::IsOff(value);
    bVar1 = !bVar1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool cmCPackExternalGenerator::StagingEnabled() const
{
  return !this->GetOption("CPACK_EXTERNAL_ENABLE_STAGING").IsOff();
}